

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmdisubwindow.cpp
# Opt level: O0

void QMdiSubWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  int iVar2;
  QMetaType QVar3;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QMdiSubWindow *_t;
  WindowStates in_stack_ffffffffffffff78;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffff7c;
  QWidget *in_stack_ffffffffffffff80;
  QWidget *in_stack_ffffffffffffff88;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff90;
  int *piVar4;
  QMdiSubWindowPrivate *in_stack_ffffffffffffffa0;
  QMdiSubWindow *in_stack_ffffffffffffffb0;
  QMetaType local_20;
  QMetaType local_18;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff80 = (QWidget *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff80) {
    case (QWidget *)0x0:
      local_c = **(undefined4 **)(in_RCX + 8);
      local_10 = **(undefined4 **)(in_RCX + 0x10);
      windowStateChanged((QMdiSubWindow *)0x63791c,(WindowStates)in_stack_ffffffffffffff7c.i,
                         in_stack_ffffffffffffff78);
      break;
    case (QWidget *)0x1:
      aboutToActivate((QMdiSubWindow *)0x637928);
      break;
    case (QWidget *)0x2:
      showSystemMenu(in_stack_ffffffffffffffb0);
      break;
    case (QWidget *)0x3:
      showShaded((QMdiSubWindow *)in_stack_ffffffffffffffa0);
      break;
    case (QWidget *)0x4:
      d_func((QMdiSubWindow *)0x63794c);
      QMdiSubWindowPrivate::_q_updateStaysOnTopHint(in_stack_ffffffffffffffa0);
      break;
    case (QWidget *)0x5:
      d_func((QMdiSubWindow *)0x637960);
      QMdiSubWindowPrivate::_q_enterInteractiveMode(in_stack_ffffffffffffffa0);
      break;
    case (QWidget *)0x6:
      d_func((QMdiSubWindow *)0x637974);
      QMdiSubWindowPrivate::_q_processFocusChanged
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 6) {
      if (**(uint **)(in_RCX + 8) < 2) {
        QVar3 = QMetaType::fromType<QWidget*>();
        **(undefined8 **)in_RCX = QVar3.d_ptr;
      }
      else {
        memset(&local_20,0,8);
        QMetaType::QMetaType(&local_20);
        **(undefined8 **)in_RCX = local_20.d_ptr;
      }
    }
    else {
      memset(&local_18,0,8);
      QMetaType::QMetaType(&local_18);
      **(undefined8 **)in_RCX = local_18.d_ptr;
    }
  }
  if ((in_ESI != 5) ||
     ((bVar1 = QtMocHelpers::
               indexOfMethod<void(QMdiSubWindow::*)(QFlags<Qt::WindowState>,QFlags<Qt::WindowState>)>
                         (in_RCX,(void **)windowStateChanged,0,0), !bVar1 &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QMdiSubWindow::*)()>
                         (in_RCX,(void **)aboutToActivate,0,1), !bVar1)))) {
    if (in_ESI == 1) {
      piVar4 = *(int **)in_RCX;
      in_stack_ffffffffffffff7c.i = in_EDX;
      if (in_EDX == 0) {
        iVar2 = keyboardSingleStep((QMdiSubWindow *)0x637ae9);
        *piVar4 = iVar2;
      }
      else if (in_EDX == 1) {
        iVar2 = keyboardPageStep((QMdiSubWindow *)0x637afe);
        *piVar4 = iVar2;
      }
    }
    if (in_ESI == 2) {
      if (in_EDX == 0) {
        setKeyboardSingleStep
                  ((QMdiSubWindow *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c.i);
      }
      else if (in_EDX == 1) {
        setKeyboardPageStep((QMdiSubWindow *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c.i);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMdiSubWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->windowStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[2]))); break;
        case 1: _t->aboutToActivate(); break;
        case 2: _t->showSystemMenu(); break;
        case 3: _t->showShaded(); break;
        case 4: _t->d_func()->_q_updateStaysOnTopHint(); break;
        case 5: _t->d_func()->_q_enterInteractiveMode(); break;
        case 6: _t->d_func()->_q_processFocusChanged((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMdiSubWindow::*)(Qt::WindowStates , Qt::WindowStates )>(_a, &QMdiSubWindow::windowStateChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMdiSubWindow::*)()>(_a, &QMdiSubWindow::aboutToActivate, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->keyboardSingleStep(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->keyboardPageStep(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setKeyboardSingleStep(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setKeyboardPageStep(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}